

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val.hpp
# Opt level: O1

Up __thiscall
yactfr::internal::
JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
::_clone(JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
         *this)

{
  JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
  *this_00;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
             *)operator_new(0x48);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,*(long *)(in_RSI + 0x28),
             *(long *)(in_RSI + 0x30) + *(long *)(in_RSI + 0x28));
  JsonScalarVal(this_00,&local_40,*(TextLocation *)(in_RSI + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_JsonVal)._vptr_JsonVal = (_func_int **)this_00;
  return (__uniq_ptr_data<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>,_true,_true>
            )this;
}

Assistant:

JsonVal::Up _clone() const override
    {
        return std::make_unique<const JsonScalarVal<ValT, KindV>>(this->_val(), this->loc());
    }